

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

xmlDtdPtr gen_xmlDtdPtr(int no,int nr)

{
  undefined8 in_R8;
  undefined8 in_R9;
  int nr_local;
  int no_local;
  
  if (no == 0) {
    _nr_local = (xmlDtdPtr)xmlNewDtd(0,"dtd","foo","bar",in_R8,in_R9,nr);
  }
  else if (no == 1) {
    _nr_local = get_api_dtd();
  }
  else {
    _nr_local = (xmlDtdPtr)0x0;
  }
  return _nr_local;
}

Assistant:

static xmlDtdPtr gen_xmlDtdPtr(int no, int nr ATTRIBUTE_UNUSED) {
    if (no == 0)
        return(xmlNewDtd(NULL, BAD_CAST "dtd", BAD_CAST"foo", BAD_CAST"bar"));
    if (no == 1) return(get_api_dtd());
    return(NULL);
}